

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnixSharedLibrary.h
# Opt level: O0

void * __thiscall beagle::plugin::UnixSharedLibrary::findSymbol(UnixSharedLibrary *this,char *name)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  char *in_RDI;
  SharedLibraryException *unaff_retaddr;
  void *sym;
  
  pvVar1 = (void *)dlsym(*(undefined8 *)(in_RDI + 8),in_RSI);
  if (pvVar1 == (void *)0x0) {
    uVar2 = __cxa_allocate_exception(0x20);
    SharedLibraryException::SharedLibraryException(unaff_retaddr,in_RDI);
    __cxa_throw(uVar2,&SharedLibraryException::typeinfo,
                SharedLibraryException::~SharedLibraryException);
  }
  return pvVar1;
}

Assistant:

void* UnixSharedLibrary::findSymbol(const char* name)
{
    void* sym = dlsym(m_handle,name);
    if (sym == 0)
    throw SharedLibraryException("Symbol Not Found");
    else
    return sym;
}